

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::ungetEnterVal
          (SPxSolverBase<double> *this,SPxId enterId,Status enterStat,double leaveVal,
          SVectorBase<double> *vec,StableSum<double> *objChange)

{
  bool bVar1;
  Status *pSVar2;
  double *pdVar3;
  int *piVar4;
  int in_EDX;
  SPxSolverBase<double> *in_RDI;
  StableSum<double> *in_R8;
  SPxLPBase<double> *in_XMM0_Qa;
  Desc *ds;
  int enterIdx;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  SPxLPBase<double> *in_stack_ffffffffffffff80;
  SVectorBase<double> *in_stack_ffffffffffffff90;
  double dVar5;
  double *in_stack_ffffffffffffff98;
  VectorBase<double> *in_stack_ffffffffffffffa0;
  SPxRowId local_50;
  SPxColId local_48;
  Desc *local_40;
  int local_34;
  StableSum<double> *local_30;
  SPxLPBase<double> *local_20;
  int local_14;
  SPxId local_8;
  
  local_30 = in_R8;
  local_20 = in_XMM0_Qa;
  local_14 = in_EDX;
  local_40 = SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  bVar1 = SPxId::isSPxColId(&local_8);
  if (bVar1) {
    SPxColId::SPxColId(&local_48,&local_8);
    local_34 = SPxLPBase<double>::number
                         (in_stack_ffffffffffffff80,
                          (SPxColId *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    if (local_14 == -2) {
      pSVar2 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *pSVar2 = P_ON_LOWER;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
      ;
      in_stack_ffffffffffffffa0 = (VectorBase<double> *)*pdVar3;
      pdVar3 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      StableSum<double>::operator+=(local_30,(double)in_stack_ffffffffffffffa0 * *pdVar3);
    }
    else {
      pSVar2 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *pSVar2 = P_ON_UPPER;
      in_stack_ffffffffffffff98 =
           VectorBase<double>::operator[]
                     ((VectorBase<double> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      in_stack_ffffffffffffff98 = (double *)*in_stack_ffffffffffffff98;
      pdVar3 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      StableSum<double>::operator+=(local_30,(double)in_stack_ffffffffffffff98 * *pdVar3);
    }
    VectorBase<double>::multAdd<double,double>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  else {
    SPxRowId::SPxRowId(&local_50,&local_8);
    local_34 = SPxLPBase<double>::number
                         (in_stack_ffffffffffffff80,
                          (SPxRowId *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    if (local_14 == -2) {
      pSVar2 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *pSVar2 = P_ON_LOWER;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
      ;
      dVar5 = *pdVar3;
      pdVar3 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      StableSum<double>::operator+=(local_30,dVar5 * *pdVar3);
    }
    else {
      pSVar2 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      *pSVar2 = P_ON_UPPER;
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
      ;
      dVar5 = *pdVar3;
      pdVar3 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      StableSum<double>::operator+=(local_30,dVar5 * *pdVar3);
    }
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)local_20,in_stack_ffffffffffffff7c);
    *pdVar3 = (double)local_20 + *pdVar3;
    in_stack_ffffffffffffff80 = local_20;
  }
  bVar1 = isId(in_RDI,&local_8);
  if (bVar1) {
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    *pdVar3 = 0.0;
    piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasibleCo,local_34);
    *piVar4 = 0;
  }
  else {
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    *pdVar3 = 0.0;
    piVar4 = DataArray<int>::operator[](&in_RDI->isInfeasible,local_34);
    *piVar4 = 0;
  }
  return;
}

Assistant:

void
SPxSolverBase<R>::ungetEnterVal(
   SPxId enterId,
   typename SPxBasisBase<R>::Desc::Status enterStat,
   R leaveVal,
   const SVectorBase<R>& vec,
   StableSum<R>& objChange
)
{
   assert(rep() == COLUMN);
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));

      if(enterStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
      {
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         objChange += theLCbound[enterIdx] * this->maxObj(enterIdx);
      }
      else
      {
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         objChange += theUCbound[enterIdx] * this->maxObj(enterIdx);
      }

      theFrhs->multAdd(leaveVal, vec);
   }
   else
   {
      enterIdx = this->number(SPxRowId(enterId));
      assert(enterId.isSPxRowId());

      if(enterStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
      {
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         objChange += (theURbound[enterIdx]) * this->maxRowObj(enterIdx);
      }
      else
      {
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         objChange += (theLRbound[enterIdx]) * this->maxRowObj(enterIdx);
      }

      (*theFrhs)[enterIdx] += leaveVal;
   }

   if(isId(enterId))
   {
      theTest[enterIdx] = 0;
      isInfeasibleCo[enterIdx] = SPxPricer<R>::NOT_VIOLATED;
   }
   else
   {
      theCoTest[enterIdx] = 0;
      isInfeasible[enterIdx] = SPxPricer<R>::NOT_VIOLATED;
   }
}